

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O0

RecyclerWeakReference<Js::EntryPointInfo> * __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
::Insert(WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
         *this,EntryPointInfo *key,uchar value,bool add,bool checkForExisting)

{
  uchar uVar1;
  int iVar2;
  int **ppiVar3;
  WeakRefDictionaryEntry<Js::EntryPointInfo,_unsigned_char> **ppWVar4;
  RecyclerWeakReference<Js::EntryPointInfo> **ppRVar5;
  RecyclerWeakReference<Js::EntryPointInfo> *pRVar6;
  RecyclerWeakReference<Js::EntryPointInfo> *weakRef;
  int local_30;
  int i;
  int previous;
  uint bucket;
  hash_t hash;
  bool checkForExisting_local;
  bool add_local;
  uchar value_local;
  EntryPointInfo *key_local;
  WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
  *this_local;
  
  bucket._1_1_ = checkForExisting;
  bucket._2_1_ = add;
  bucket._3_1_ = value;
  _hash = key;
  key_local = (EntryPointInfo *)this;
  ppiVar3 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)&this->buckets);
  if (*ppiVar3 == (int *)0x0) {
    Initialize(this,0);
  }
  previous = GetHashCode<Js::EntryPointInfo>(this,_hash);
  i = PrimePolicy::GetBucket(previous,this->size,this->modFunctionIndex);
  if ((bucket._1_1_ & 1) != 0) {
    local_30 = -1;
    iVar2 = FindEntry<Js::EntryPointInfo>(this,_hash,previous,(uint *)&i,&local_30);
    uVar1 = bucket._3_1_;
    if (iVar2 != -1) {
      if ((bucket._2_1_ & 1) == 0) {
        ppWVar4 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                            ((WriteBarrierPtr *)&this->entries);
        (*ppWVar4)[iVar2].value = uVar1;
        this->version = this->version + 1;
        ppWVar4 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                            ((WriteBarrierPtr *)&this->entries);
        ppRVar5 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                            ((WriteBarrierPtr *)&(*ppWVar4)[iVar2].key);
        return *ppRVar5;
      }
      Js::Throw::FatalInternalError(-0x7fffbffb);
    }
  }
  pRVar6 = Memory::Recycler::CreateWeakReferenceHandle<Js::EntryPointInfo>(this->recycler,_hash);
  pRVar6 = Insert(this,pRVar6,bucket._3_1_,previous,i);
  return pRVar6;
}

Assistant:

const RecyclerWeakReference<TKey>* Insert(TKey* key, TValue value, bool add, bool checkForExisting = true)
        {
            if (buckets == nullptr) Initialize(0);

            hash_t hash = GetHashCode(key);
            uint bucket = PrimePolicy::GetBucket(hash, size, modFunctionIndex);

            if (checkForExisting)
            {
                int previous = -1;
                int i = FindEntry(key, hash, bucket, previous);

                if (i != -1)
                {
                    if (add)
                    {
                        Js::Throw::FatalInternalError();
                    }

                    entries[i].value = value;
                    version++;
                    return entries[i].key;
                }
            }

            // We know we need to insert- so first try creating the weak reference, before adding it to
            // the dictionary. If we OOM here, we still leave the dictionary as we found it.
            const RecyclerWeakReference<TKey>* weakRef = recycler->CreateWeakReferenceHandle<TKey>(key);

            return Insert(weakRef, value, hash, bucket);
        }